

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O2

void av1_get_nz_map_contexts_c
               (uint8_t *levels,int16_t *scan,uint16_t eob,TX_SIZE tx_size,TX_CLASS tx_class,
               int8_t *coeff_contexts)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  undefined7 in_register_00000009;
  long lVar7;
  byte *pbVar8;
  byte bVar9;
  undefined6 in_register_00000012;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  undefined7 in_register_00000081;
  byte bVar14;
  int col;
  ulong uVar13;
  
  iVar2 = get_txb_bhl(tx_size);
  iVar3 = get_txb_wide(tx_size);
  bVar5 = (byte)iVar2;
  uVar12 = (int)CONCAT62(in_register_00000012,eob) - 1;
  uVar13 = (ulong)uVar12;
  lVar7 = (long)(1 << (bVar5 & 0x1f));
  lVar4 = (long)(2 << (bVar5 & 0x1f));
  iVar3 = iVar3 << (bVar5 & 0x1f);
  bVar14 = (long)(iVar3 / 4) < (long)uVar13 | 2;
  if ((long)uVar13 <= (long)(iVar3 / 8)) {
    bVar14 = 1;
  }
  if (uVar12 == 0) {
    bVar14 = 0;
  }
  uVar11 = (ulong)(uint)(0 << (bVar5 & 0x1f));
  do {
    if ((CONCAT62(in_register_00000012,eob) & 0xffffffff) == uVar11) {
      return;
    }
    uVar12 = (uint)scan[uVar11];
    bVar9 = bVar14;
    if (uVar13 != uVar11) {
      iVar3 = (int)uVar12 >> (bVar5 & 0x1f);
      lVar10 = (long)(int)(uVar12 + iVar3 * 4);
      iVar2 = (uint)""[levels[lVar10 + 1]] + (uint)""[levels[lVar7 + 4 + lVar10]];
      if (tx_class == '\x02') {
        iVar2 = iVar2 + (uint)""[levels[lVar10 + 3]] + (uint)""[levels[lVar10 + 2]];
        pbVar8 = levels + lVar10 + 4;
      }
      else if (tx_class == '\0') {
        iVar2 = iVar2 + (uint)""[levels[lVar4 + lVar10 + 8]] + (uint)""[levels[lVar7 + lVar10 + 5]];
        pbVar8 = levels + lVar10 + 2;
      }
      else {
        iVar2 = iVar2 + (uint)""[levels[(long)(3 << (bVar5 & 0x1f)) + lVar10 + 0xc]] +
                        (uint)""[levels[lVar4 + lVar10 + 8]];
        pbVar8 = levels + (4 << (bVar5 & 0x1f)) + lVar10 + 0x10;
      }
      bVar9 = 0;
      if (uVar12 != 0 || (int)CONCAT71(in_register_00000081,tx_class) != 0) {
        uVar6 = (uint)""[*pbVar8] + iVar2 + 1 >> 1;
        if (3 < uVar6) {
          uVar6 = 4;
        }
        if (tx_class == '\x02') {
          bVar9 = (char)uVar6 + (char)nz_map_ctx_offset_1d[uVar12 & ~(-1 << (bVar5 & 0x1f))];
        }
        else {
          if (tx_class == '\x01') {
            cVar1 = (char)nz_map_ctx_offset_1d[iVar3];
          }
          else {
            bVar9 = 0;
            if (tx_class != '\0') goto LAB_001a9065;
            cVar1 = av1_nz_map_ctx_offset[CONCAT71(in_register_00000009,tx_size) & 0xffffffff]
                    [(int)uVar12];
          }
          bVar9 = (char)uVar6 + cVar1;
        }
      }
    }
LAB_001a9065:
    coeff_contexts[(int)uVar12] = bVar9;
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void av1_get_nz_map_contexts_c(const uint8_t *const levels,
                               const int16_t *const scan, const uint16_t eob,
                               const TX_SIZE tx_size, const TX_CLASS tx_class,
                               int8_t *const coeff_contexts) {
  const int bhl = get_txb_bhl(tx_size);
  const int width = get_txb_wide(tx_size);
  for (int i = 0; i < eob; ++i) {
    const int pos = scan[i];
    coeff_contexts[pos] = get_nz_map_ctx(levels, pos, bhl, width, i,
                                         i == eob - 1, tx_size, tx_class);
  }
}